

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variant.hpp
# Opt level: O1

int ranges::detail::
    variant_visit_<ranges::detail::variant_data_<meta::list<ranges::detail::indexed_datum<int&,std::integral_constant<unsigned_long,1ul>>>,true>::type_const,ranges::detail::variant_visitor<ranges::detail::unique_visitor<ranges::variant<int&>,ranges::variant<int&,int&>>,ranges::variant<void,void>>,ranges::detail::indexed_element_fn>
              (long n,anon_union_8_2_3194c211_for_type_0 *self,variant<int_&> *param_3,
              variant<void,_void> *param_4)

{
  anon_union_8_2_3194c211_for_type_0 aVar1;
  
  if (n == 0) {
    aVar1 = *self;
    variant<int_&>::clear_(param_3);
    (param_3->super_variant_data<int_&>).field_0 = aVar1;
    param_3->index_ = 0;
    variant<void,_void>::emplace<1UL>(param_4);
    return 0;
  }
  __assert_fail("false",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/furkankirac[P]cs321-2020-21-fall/range-v3/include/range/v3/detail/variant.hpp"
                ,0x15a,
                "int ranges::detail::variant_visit_(std::size_t, variant_nil, Fun, Proj) [Fun = ranges::detail::variant_visitor<ranges::detail::unique_visitor<ranges::variant<int &>, ranges::variant<int &, int &>>, ranges::variant<void, void>>, Proj = ranges::detail::indexed_element_fn]"
               );
}

Assistant:

constexpr int variant_visit_(std::size_t n, Data & self, Fun fun, Proj proj = {})
        {
            return 0 == n ? ((void)invoke(fun, invoke(proj, self.head)), 0)
                          : detail::variant_visit_(
                                n - 1, self.tail, detail::move(fun), detail::move(proj));
        }